

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_nextsecret(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  size_t sVar2;
  char *mapname;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (netgame) {
    Printf("Use \x1c+changemap\x1c- instead. \x1c+Nextsecret\x1c- is for single-player only.\n");
  }
  else {
    sVar2 = FString::Len(&level.NextSecretMap);
    if ((sVar2 != 0) && (iVar1 = FString::Compare(&level.NextSecretMap,"enDSeQ",6), iVar1 != 0)) {
      mapname = FString::operator_cast_to_char_(&level.NextSecretMap);
      G_DeferedInitNew(mapname,-1);
      return;
    }
    Printf("no next secret map!\n");
  }
  return;
}

Assistant:

CCMD(nextsecret)
{
	if (netgame)
	{
		Printf ("Use " TEXTCOLOR_BOLD "changemap" TEXTCOLOR_NORMAL " instead. " TEXTCOLOR_BOLD "Nextsecret"
				TEXTCOLOR_NORMAL " is for single-player only.\n");
		return;
	}

	if (level.NextSecretMap.Len() > 0 && level.NextSecretMap.Compare("enDSeQ", 6))
	{
		G_DeferedInitNew(level.NextSecretMap);
	}
	else
	{
		Printf("no next secret map!\n");
	}
}